

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<double>(double x)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int extraout_var;
  dummy_int local_20;
  double local_18;
  double x_local;
  
  local_18 = x;
  bVar1 = ::fmt::v5::internal::const_check<bool>(true);
  if (bVar1) {
    uVar2 = isinf(local_18);
    x_local._7_1_ = (uVar2 & 1) != 0;
  }
  else {
    local_20.data[0] = ::fmt::v5::internal::_finite(local_18);
    local_20.data[1] = extraout_var;
    iVar3 = ::fmt::v5::internal::dummy_int::operator_cast_to_int(&local_20);
    x_local._7_1_ = iVar3 == 0;
  }
  return x_local._7_1_;
}

Assistant:

static bool isinfinity(T x) {
    using namespace fmt::internal;
    // The resolution "priority" is:
    // isinf macro > std::isinf > ::isinf > fmt::internal::isinf
    if (const_check(sizeof(isinf(x)) != sizeof(dummy_int)))
      return isinf(x) != 0;
    return !_finite(static_cast<double>(x));
  }